

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O3

ggml_backend_t ggml_backend_init_best(void)

{
  ggml_backend_dev_t pgVar1;
  ggml_backend_t pgVar2;
  
  pgVar1 = ggml_backend_dev_by_type(GGML_BACKEND_DEVICE_TYPE_GPU);
  if (pgVar1 == (ggml_backend_dev_t)0x0) {
    pgVar1 = ggml_backend_dev_by_type(GGML_BACKEND_DEVICE_TYPE_CPU);
    if (pgVar1 == (ggml_backend_dev_t)0x0) {
      return (ggml_backend_t)0x0;
    }
  }
  pgVar2 = (ggml_backend_t)ggml_backend_dev_init(pgVar1,0);
  return pgVar2;
}

Assistant:

ggml_backend_t ggml_backend_init_best(void) {
    ggml_backend_dev_t dev = ggml_backend_dev_by_type(GGML_BACKEND_DEVICE_TYPE_GPU);
    if (!dev) {
        dev = ggml_backend_dev_by_type(GGML_BACKEND_DEVICE_TYPE_CPU);
    }
    if (!dev) {
        return nullptr;
    }
    return ggml_backend_dev_init(dev, nullptr);
}